

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_true,_false>::pop_block_
          (DaTrie<false,_true,_false> *this,uint32_t block_pos,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  uint uVar1;
  uint32_t uVar2;
  int in_ESI;
  long in_RDI;
  uint32_t prev;
  uint32_t next;
  uint32_t pos;
  uint32_t end;
  uint32_t begin;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  undefined4 local_24;
  
  local_24 = in_ESI * 0x100;
  uVar1 = local_24 + 0x100;
  for (; local_24 < uVar1; local_24 = local_24 + 1) {
    if (local_24 == *(uint *)(in_RDI + 0x60)) {
      uVar2 = next_((DaTrie<false,_true,_false> *)
                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (uint32_t)((ulong)in_RDI >> 0x20));
      *(uint32_t *)(in_RDI + 0x60) = uVar2;
    }
    next_((DaTrie<false,_true,_false> *)
          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
          (uint32_t)((ulong)in_RDI >> 0x20));
    in_stack_ffffffffffffffd4 =
         prev_((DaTrie<false,_true,_false> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (uint32_t)((ulong)in_RDI >> 0x20));
    set_next_((DaTrie<false,_true,_false> *)
              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
              (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
    set_prev_((DaTrie<false,_true,_false> *)
              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
              (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
  }
  return;
}

Assistant:

void pop_block_(uint32_t block_pos, std::vector<Block>& blocks) {
    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;

    for (auto pos = begin; pos < end; ++pos) {
      if (pos == head_pos_) {
        head_pos_ = next_(head_pos_);
      }
      auto next = next_(pos);
      auto prev = prev_(pos);
      set_next_(prev, next);
      set_prev_(next, prev);
    }
  }